

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugTextEncoding(char *str)

{
  char *in_text;
  char cVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ImFontGlyph *pIVar6;
  char *text_end;
  char *pcVar7;
  ulong uVar8;
  uint c;
  uint local_3c;
  ImVec2 local_38;
  
  Text("Text: \"%s\"",str);
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar4 = BeginTable("list",4,0x27c0,&local_38,0.0);
  if (bVar4) {
    TableSetupColumn("Offset",0,0.0,0);
    TableSetupColumn("UTF-8",0,0.0,0);
    TableSetupColumn("Glyph",0,0.0,0);
    TableSetupColumn("Codepoint",0,0.0,0);
    TableHeadersRow();
    cVar1 = *str;
    in_text = str;
    while (cVar1 != '\0') {
      uVar5 = ImTextCharFromUtf8(&local_3c,in_text,(char *)0x0);
      TableNextColumn();
      Text("%d",(ulong)(uint)((int)in_text - (int)str));
      TableNextColumn();
      if (0 < (int)uVar5) {
        uVar8 = 0;
        do {
          if ((uVar8 != 0) && (pIVar2 = GImGui->CurrentWindow, pIVar2->SkipItems == false)) {
            (pIVar2->DC).CursorPos.x =
                 (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
            (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
            (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
            (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
            (pIVar2->DC).IsSameLine = true;
          }
          Text("0x%02X",(ulong)(byte)in_text[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      TableNextColumn();
      uVar3 = local_3c;
      pIVar6 = ImFont::FindGlyphNoFallback(GImGui->Font,(ImWchar)local_3c);
      if (pIVar6 == (ImFontGlyph *)0x0) {
        pcVar7 = "[missing]";
        if (uVar3 == 0xfffd) {
          pcVar7 = "[invalid]";
        }
        text_end = (char *)0x0;
      }
      else {
        text_end = in_text + (int)uVar5;
        pcVar7 = in_text;
      }
      TextUnformatted(pcVar7,text_end);
      TableNextColumn();
      Text("U+%04X",(ulong)local_3c);
      pcVar7 = in_text + (int)uVar5;
      in_text = in_text + (int)uVar5;
      cVar1 = *pcVar7;
    }
    EndTable();
  }
  return;
}

Assistant:

void ImGui::DebugTextEncoding(const char* str)
{
    Text("Text: \"%s\"", str);
    if (!BeginTable("list", 4, ImGuiTableFlags_Borders | ImGuiTableFlags_RowBg | ImGuiTableFlags_SizingFixedFit))
        return;
    TableSetupColumn("Offset");
    TableSetupColumn("UTF-8");
    TableSetupColumn("Glyph");
    TableSetupColumn("Codepoint");
    TableHeadersRow();
    for (const char* p = str; *p != 0; )
    {
        unsigned int c;
        const int c_utf8_len = ImTextCharFromUtf8(&c, p, NULL);
        TableNextColumn();
        Text("%d", (int)(p - str));
        TableNextColumn();
        for (int byte_index = 0; byte_index < c_utf8_len; byte_index++)
        {
            if (byte_index > 0)
                SameLine();
            Text("0x%02X", (int)(unsigned char)p[byte_index]);
        }
        TableNextColumn();
        if (GetFont()->FindGlyphNoFallback((ImWchar)c))
            TextUnformatted(p, p + c_utf8_len);
        else
            TextUnformatted((c == IM_UNICODE_CODEPOINT_INVALID) ? "[invalid]" : "[missing]");
        TableNextColumn();
        Text("U+%04X", (int)c);
        p += c_utf8_len;
    }
    EndTable();
}